

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaComparePreserveCollapseStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  
  while (((ulong)*y < 0x21 && ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0))) {
    y = y + 1;
  }
  while( true ) {
    bVar1 = *x;
    bVar2 = *y;
    if (bVar1 == 0) break;
    uVar3 = (uint)bVar2;
    if (uVar3 < 0x21) {
      if ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
        if ((ulong)uVar3 != 0) goto LAB_001c5f52;
      }
      else {
        if (bVar1 == 0x20) {
          do {
            y = y + 1;
            if (0x20 < (ulong)*y) break;
          } while ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0);
          goto LAB_001c5f5c;
        }
        if (bVar1 < 0x20) goto LAB_001c5f95;
      }
LAB_001c5f89:
      bVar4 = invert != 0;
      goto LAB_001c5f9a;
    }
LAB_001c5f52:
    if (bVar1 < bVar2) goto LAB_001c5f95;
    if (bVar1 != bVar2) goto LAB_001c5f89;
    y = y + 1;
LAB_001c5f5c:
    x = x + 1;
  }
  if (bVar2 == 0) {
    return 0;
  }
  do {
    y = y + 1;
    if (0x20 < bVar2) {
LAB_001c5f95:
      bVar4 = invert == 0;
LAB_001c5f9a:
      return -(uint)bVar4 | 1;
    }
    if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
      if ((ulong)bVar2 == 0) {
        return 0;
      }
      goto LAB_001c5f95;
    }
    bVar2 = *y;
  } while( true );
}

Assistant:

static int
xmlSchemaComparePreserveCollapseStrings(const xmlChar *x,
				        const xmlChar *y,
					int invert)
{
    int tmp;

    /*
    * Skip leading blank chars of the collapsed string.
    */
    while IS_WSP_BLANK_CH(*y)
	y++;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		/*
		* The yv character would have been replaced to 0x20.
		*/
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    x++;
	    y++;
	    /*
	    * Skip contiguous blank chars of the collapsed string.
	    */
	    while IS_WSP_BLANK_CH(*y)
		y++;
	} else {
	    tmp = *x++ - *y++;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
    }